

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall cnn::LookupParameters::LookupParameters(LookupParameters *this,uint n,Dim *d)

{
  uint *puVar1;
  pointer pTVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  float *pfVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong __n;
  allocator_type local_4a;
  allocator_type local_49;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_48;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *local_40;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *local_38;
  
  (this->super_ParametersBase)._vptr_ParametersBase = (_func_int **)&PTR_scale_parameters_002ab6a0;
  uVar3 = *(undefined8 *)(d->d + 2);
  uVar4 = *(undefined8 *)(d->d + 4);
  uVar5 = *(undefined8 *)(d->d + 6);
  *(undefined8 *)(this->dim).d = *(undefined8 *)d->d;
  *(undefined8 *)((this->dim).d + 2) = uVar3;
  *(undefined8 *)((this->dim).d + 4) = uVar4;
  *(undefined8 *)((this->dim).d + 6) = uVar5;
  (this->dim).bd = d->bd;
  local_38 = &this->values;
  __n = (ulong)n;
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector(local_38,__n,&local_49);
  local_40 = &this->grads;
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector(local_40,__n,&local_4a);
  (this->non_zero_grads)._M_h._M_buckets = &(this->non_zero_grads)._M_h._M_single_bucket;
  (this->non_zero_grads)._M_h._M_bucket_count = 1;
  (this->non_zero_grads)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->non_zero_grads)._M_h._M_element_count = 0;
  (this->non_zero_grads)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->non_zero_grads)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->non_zero_grads)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (n != 0) {
    local_48 = &this->non_zero_grads;
    uVar8 = 0;
    do {
      pTVar2 = (local_38->super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pTVar2[uVar8].d.bd = d->bd;
      uVar3 = *(undefined8 *)d->d;
      uVar4 = *(undefined8 *)(d->d + 2);
      uVar5 = *(undefined8 *)(d->d + 6);
      puVar1 = pTVar2[uVar8].d.d + 4;
      *(undefined8 *)puVar1 = *(undefined8 *)(d->d + 4);
      *(undefined8 *)(puVar1 + 2) = uVar5;
      *(undefined8 *)pTVar2[uVar8].d.d = uVar3;
      *(undefined8 *)(pTVar2[uVar8].d.d + 2) = uVar4;
      iVar9 = 1;
      if ((ulong)d->nd != 0) {
        uVar7 = 0;
        do {
          iVar9 = iVar9 * d->d[uVar7];
          uVar7 = uVar7 + 1;
        } while (d->nd != uVar7);
      }
      pfVar6 = (float *)AlignedMemoryPool::allocate(ps,(ulong)(iVar9 * d->bd) << 2);
      pTVar2[uVar8].v = pfVar6;
      TensorTools::Randomize(pTVar2 + uVar8);
      pTVar2 = (local_40->super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pTVar2[uVar8].d.bd = d->bd;
      uVar3 = *(undefined8 *)d->d;
      uVar4 = *(undefined8 *)(d->d + 2);
      uVar5 = *(undefined8 *)(d->d + 6);
      puVar1 = pTVar2[uVar8].d.d + 4;
      *(undefined8 *)puVar1 = *(undefined8 *)(d->d + 4);
      *(undefined8 *)(puVar1 + 2) = uVar5;
      *(undefined8 *)pTVar2[uVar8].d.d = uVar3;
      *(undefined8 *)(pTVar2[uVar8].d.d + 2) = uVar4;
      iVar9 = 1;
      if ((ulong)d->nd != 0) {
        uVar7 = 0;
        do {
          iVar9 = iVar9 * d->d[uVar7];
          uVar7 = uVar7 + 1;
        } while (d->nd != uVar7);
      }
      pfVar6 = (float *)AlignedMemoryPool::allocate(ps,(ulong)(iVar9 * d->bd) << 2);
      pTVar2[uVar8].v = pfVar6;
      TensorTools::Zero(pTVar2 + uVar8);
      uVar8 = uVar8 + 1;
    } while (uVar8 != __n);
  }
  return;
}

Assistant:

LookupParameters::LookupParameters(unsigned n, const Dim& d) : dim(d), values(n), grads(n) {
  for (unsigned i = 0; i < n; ++i) {
    auto& v = values[i];
    v.d = d;
    v.v = static_cast<float*>(ps->allocate(d.size() * sizeof(float)));
    TensorTools::Randomize(v);

    auto& g = grads[i];
    g.d = d;
    g.v = static_cast<float*>(ps->allocate(d.size() * sizeof(float)));
    TensorTools::Zero(g);
  }
}